

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O0

void __thiscall PyreNet::Layer::Layer(Layer *this,int size,int prevSize,Activation *activation)

{
  int local_30;
  int i;
  Activation *activation_local;
  int prevSize_local;
  int size_local;
  Layer *this_local;
  
  activation_local._0_4_ = prevSize;
  activation_local._4_4_ = size;
  _prevSize_local = this;
  std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::vector(&this->nodes);
  std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::reserve
            (&this->nodes,(long)activation_local._4_4_);
  for (local_30 = 0; local_30 < activation_local._4_4_; local_30 = local_30 + 1) {
    std::vector<PyreNet::Perceptron,std::allocator<PyreNet::Perceptron>>::emplace_back<int_const&>
              ((vector<PyreNet::Perceptron,std::allocator<PyreNet::Perceptron>> *)this,
               (int *)&activation_local);
  }
  this->activation = activation;
  return;
}

Assistant:

Layer::Layer(const int size, const int prevSize, Activation *activation) {
        this->nodes.reserve(size);
        for (int i = 0; i < size; i++) {
            this->nodes.emplace_back(prevSize);
        }
        this->activation = activation;
    }